

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope.h
# Opt level: O2

void __thiscall vpl::Scope::Finish(Scope *this)

{
  pointer pNVar1;
  ostream *poVar2;
  ulong uVar3;
  __node_base *p_Var4;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  _Stack_68;
  
  poVar2 = std::operator<<(this->out_,'#');
  poVar2 = std::operator<<(poVar2,"void vpl::Scope::Finish()");
  std::operator<<(poVar2,'\n');
  for (uVar3 = 0;
      pNVar1 = (this->scopes_).super__Vector_base<vpl::NameScope,_std::allocator<vpl::NameScope>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(this->scopes_).
                             super__Vector_base<vpl::NameScope,_std::allocator<vpl::NameScope>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pNVar1) / 0x48);
      uVar3 = uVar3 + 1) {
    if (pNVar1[uVar3].is_global_ == true) {
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable(&_Stack_68,&pNVar1[uVar3].offsets_._M_h);
      p_Var4 = &_Stack_68._M_before_begin;
      while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
        poVar2 = std::operator<<(this->out_,"    var ");
        poVar2 = std::operator<<(poVar2,(string *)(p_Var4 + 1));
        std::operator<<(poVar2," 1\n");
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&_Stack_68);
    }
  }
  return;
}

Assistant:

void Finish() {
        LOG
        for (size_t i = 0; i < scopes_.size(); ++i) {
            if (scopes_[i].IsGlobal()) {
                for (const auto& [name, offset] : scopes_[i].GetOffsets()) {
                    out_ << "    var " << name << " 1\n";
                }
            }
        }
    }